

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flags.cc
# Opt level: O2

Flags * __thiscall pstack::Flags::done(Flags *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  long lVar1;
  vector<option,_std::allocator<option>_> *__range1;
  option *opt;
  long lVar2;
  option local_58;
  
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(this + 0x48);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (this_00,"");
  lVar1 = *(long *)(this + 8);
  for (lVar2 = *(long *)this; lVar2 != lVar1; lVar2 = lVar2 + 0x20) {
    if (0 < *(int *)(lVar2 + 0x18)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (this_00,(char)*(int *)(lVar2 + 0x18));
      if (*(int *)(lVar2 + 8) != 0) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,':');
      }
    }
  }
  local_58.flag = (int *)0x0;
  local_58.val = 0;
  local_58._28_4_ = 0;
  local_58.name = (char *)0x0;
  local_58.has_arg = 0;
  local_58._12_4_ = 0;
  std::vector<option,_std::allocator<option>_>::emplace_back<option>
            ((vector<option,_std::allocator<option>_> *)this,&local_58);
  return this;
}

Assistant:

const Flags &
Flags::done()
{
    shortOptions = "";
    for (auto &opt : longOptions) {
        if (opt.val > 0) {
           shortOptions += char(opt.val);
           if (opt.has_arg != 0)
               shortOptions += ':';
        }
    }
    longOptions.push_back({nullptr, 0, nullptr, 0});
    return *this;
}